

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceObjectArchive::DeviceObjectArchive(DeviceObjectArchive *this,Uint32 ContentVersion)

{
  Uint32 ContentVersion_local;
  DeviceObjectArchive *this_local;
  
  std::
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  ::unordered_map(&this->m_NamedResources);
  std::array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  ::array(&this->m_DeviceShaders);
  RefCntAutoPtr<Diligent::IDataBlob>::RefCntAutoPtr(&this->m_pArchiveData);
  this->m_ContentVersion = ContentVersion;
  return;
}

Assistant:

DeviceObjectArchive::DeviceObjectArchive(Uint32 ContentVersion) noexcept :
    m_ContentVersion{ContentVersion}
{
}